

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Environment::lookup<tcu::Matrix<float,3,4>>
          (Environment *this,Variable<tcu::Matrix<float,_3,_4>_> *variable)

{
  IVal *pIVar1;
  mapped_type *pmVar2;
  key_type local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)&variable->m_name);
  pmVar2 = de::
           lookup<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
                     (&this->m_map,&local_30);
  pIVar1 = (IVal *)pmVar2->m_ptr;
  std::__cxx11::string::~string((string *)&local_30);
  return pIVar1;
}

Assistant:

typename Traits<T>::IVal&	lookup	(const Variable<T>& variable) const
	{
		deUint8* const data = de::lookup(m_map, variable.getName()).get();

		return *reinterpret_cast<typename Traits<T>::IVal*>(data);
	}